

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.h
# Opt level: O2

void __thiscall ipx::Model::Model(Model *this)

{
  this->dualized_ = false;
  this->num_rows_ = 0;
  this->num_cols_ = 0;
  this->num_dense_cols_ = 0;
  this->nz_dense_ = 0;
  SparseMatrix::SparseMatrix(&this->AI_);
  SparseMatrix::SparseMatrix(&this->AIt_);
  this->num_constr_ = 0;
  this->num_eqconstr_ = 0;
  this->num_var_ = 0;
  this->num_free_var_ = 0;
  this->norm_bounds_ = 0.0;
  this->norm_c_ = 0.0;
  (this->ub_)._M_size = 0;
  (this->ub_)._M_data = (double *)0x0;
  (this->lb_)._M_size = 0;
  (this->lb_)._M_data = (double *)0x0;
  (this->c_)._M_size = 0;
  (this->c_)._M_data = (double *)0x0;
  (this->b_)._M_size = 0;
  (this->b_)._M_data = (double *)0x0;
  this->num_entries_ = 0;
  (this->boxed_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->boxed_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->boxed_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->constr_type_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->constr_type_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->constr_type_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->norm_obj_ = 0.0;
  this->norm_rhs_ = 0.0;
  (this->scaled_obj_)._M_size = 0;
  (this->scaled_obj_)._M_data = (double *)0x0;
  (this->scaled_rhs_)._M_size = 0;
  (this->scaled_rhs_)._M_data = (double *)0x0;
  (this->scaled_lbuser_)._M_size = 0;
  (this->scaled_lbuser_)._M_data = (double *)0x0;
  (this->scaled_ubuser_)._M_size = 0;
  (this->scaled_ubuser_)._M_data = (double *)0x0;
  SparseMatrix::SparseMatrix(&this->A_);
  (this->colscale_)._M_data = (double *)0x0;
  (this->rowscale_)._M_size = 0;
  (this->flipped_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->colscale_)._M_size = 0;
  (this->flipped_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->flipped_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rowscale_)._M_data = (double *)0x0;
  return;
}

Assistant:

Model() = default;